

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O1

PAL_ERROR FILEGetSHMFileLocks(LPCSTR filename,SHMPTR *pshmFileLocks,BOOL noCreate)

{
  int iVar1;
  SHMPTR shmptr;
  SHMPTR *pSVar2;
  char *__s1;
  SHMPTR SVar3;
  LPVOID pvVar4;
  PAL_ERROR PVar5;
  bool bVar6;
  
  SHMLock();
  shmptr = SHMGetInfo(SIID_FILE_LOCKS);
  while (shmptr != 0) {
    pSVar2 = (SHMPTR *)SHMPtrToPtr(shmptr);
    if (pSVar2 == (SHMPTR *)0x0) {
LAB_0012a0b9:
      fprintf(_stderr,"] %s %s:%d","FILEGetSHMFileLocks",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x2c4);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      PVar5 = 0x54f;
      goto LAB_0012a28d;
    }
    if (*pSVar2 == 0) {
      __s1 = (char *)0x0;
      bVar6 = false;
    }
    else {
      __s1 = (char *)SHMPtrToPtr(*pSVar2);
      bVar6 = __s1 == (char *)0x0;
    }
    if (bVar6) goto LAB_0012a0b9;
    if (__s1 == (char *)0x0) {
      PVar5 = 0x54f;
      if (PAL_InitializeChakraCoreCalled != false) goto LAB_0012a28d;
      goto LAB_0012a22b;
    }
    iVar1 = strcmp(__s1,filename);
    if (iVar1 == 0) {
      *(int *)(pSVar2 + 2) = (int)pSVar2[2] + 1;
      goto LAB_0012a1c5;
    }
    shmptr = pSVar2[3];
  }
  if (noCreate == 0) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_0012a22b:
      abort();
    }
    shmptr = SHMalloc(0x38);
    if (shmptr == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a22b;
      PVar5 = 8;
      goto LAB_0012a28a;
    }
    pSVar2 = (SHMPTR *)SHMPtrToPtr(shmptr);
    if (pSVar2 == (SHMPTR *)0x0) {
      fprintf(_stderr,"] %s %s:%d","FILEGetSHMFileLocks",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x2ec);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
LAB_0012a27c:
      PVar5 = 0x54f;
    }
    else {
      SVar3 = SHMStrDup(filename);
      *pSVar2 = SVar3;
      if (SVar3 != 0) {
        pvVar4 = (LPVOID)0x0;
        pSVar2[1] = 0;
        pSVar2[4] = 0;
        SVar3 = SHMGetInfo(SIID_FILE_LOCKS);
        pSVar2[3] = SVar3;
        *(undefined4 *)(pSVar2 + 2) = 1;
        pSVar2[5] = 0xffffffff;
        *(undefined4 *)(pSVar2 + 6) = 0;
        if (SVar3 == 0) {
          bVar6 = false;
        }
        else {
          pvVar4 = SHMPtrToPtr(SVar3);
          bVar6 = pvVar4 == (LPVOID)0x0;
        }
        if (!bVar6) {
          if (pvVar4 != (LPVOID)0x0) {
            *(SHMPTR *)((long)pvVar4 + 0x20) = shmptr;
          }
          SHMSetInfo(SIID_FILE_LOCKS,shmptr);
LAB_0012a1c5:
          PVar5 = 0;
          goto LAB_0012a28d;
        }
        fprintf(_stderr,"] %s %s:%d","FILEGetSHMFileLocks",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                ,0x303);
        fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
        SHMfree(*pSVar2);
        goto LAB_0012a27c;
      }
      PVar5 = 8;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012a22b;
    }
    SHMfree(shmptr);
  }
  else {
    PVar5 = 0;
  }
LAB_0012a28a:
  shmptr = 0;
LAB_0012a28d:
  SHMRelease();
  if (PVar5 == 0) {
    *pshmFileLocks = shmptr;
  }
  return PVar5;
}

Assistant:

PAL_ERROR
FILEGetSHMFileLocks(
    LPCSTR filename,
    SHMPTR *pshmFileLocks,
    BOOL noCreate
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmPtrRet = 0;
    SHMFILELOCKS *filelocksPtr, *nextFilelocksPtr;
    char *unix_filename;

    SHMLock();

    shmPtrRet = SHMGetInfo(SIID_FILE_LOCKS);

    while(shmPtrRet != 0)
    {        
        if ( (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, filelocksPtr, shmPtrRet) == FALSE) ||
             (SHMPTR_TO_TYPED_PTR_BOOL(char, unix_filename, filelocksPtr->unix_filename) == FALSE))
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }

        if (unix_filename == NULL)
        {
            ERROR("Unexpected lock file name value.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
        
        if (strcmp(unix_filename, filename) == 0)
        {
            filelocksPtr->refCount++;
            goto EXIT;
        }
        
        shmPtrRet = filelocksPtr->next;
    }

    /* the file has never been locked before.*/
    shmPtrRet = 0;
    if (noCreate)
    {
      goto EXIT;
    }

    TRACE("Create a new entry in the file lock list in SHM\n");

    /* Create a new entry in the file lock list in SHM */
    if ((shmPtrRet = SHMalloc(sizeof(SHMFILELOCKS))) == 0)
    {
        ERROR("Can't allocate SHMFILELOCKS structure\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto EXIT;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, filelocksPtr, shmPtrRet) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto CLEANUP1;
    }

    filelocksPtr->unix_filename = SHMStrDup(filename);
    if (filelocksPtr->unix_filename == 0)
    {
        ERROR("Can't allocate shared memory for filename\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto CLEANUP1;
    }

    filelocksPtr->fileLockedRgns = 0;
    filelocksPtr->prev = 0;
    filelocksPtr->next = SHMGetInfo(SIID_FILE_LOCKS);
    filelocksPtr->refCount = 1;
    filelocksPtr->share_mode = SHARE_MODE_NOT_INITALIZED;
    filelocksPtr->nbReadAccess = 0;
    filelocksPtr->nbWriteAccess = 0;

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, nextFilelocksPtr, filelocksPtr->next) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto CLEANUP2;
    }
    
    if (nextFilelocksPtr != NULL)
    {
        nextFilelocksPtr->prev = shmPtrRet;
    }

    SHMSetInfo(SIID_FILE_LOCKS, shmPtrRet);
    goto EXIT;

CLEANUP2:
    SHMfree(filelocksPtr->unix_filename);
CLEANUP1:
    SHMfree(shmPtrRet);
    shmPtrRet = 0;
EXIT:    
    SHMRelease();

    if (NO_ERROR == palError)
    {
        *pshmFileLocks = shmPtrRet;
    }
    
    return palError;
}